

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FractionalSpacingModeCase::iterate
          (FractionalSpacingModeCase *this)

{
  SpacingMode mode;
  int iVar1;
  deUint32 dVar2;
  GLenum err;
  TestLog *log_00;
  undefined4 extraout_var;
  char *pcVar3;
  ShaderProgram *this_00;
  Functions *gl_00;
  const_iterator __first;
  const_iterator __last;
  reference pfVar4;
  RenderContext *renderCtx_00;
  size_type sVar5;
  const_reference pvVar6;
  int local_148;
  float local_144;
  int additionalSegmentLocation;
  float additionalSegmentLength;
  Result tfResult;
  int local_118;
  float outerLevel1;
  int tessLevelCaseNdx;
  bool success;
  TFHandler tfHandler;
  vector<int,_std::allocator<int>_> additionalSegmentLocations;
  vector<float,_std::allocator<float>_> additionalSegmentLengths;
  __normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> local_70;
  int local_64;
  undefined1 local_60 [4];
  int maxNumVertices;
  vector<float,_std::allocator<float>_> tessLevelCases;
  int tessLevelOuter1Loc;
  Functions *gl;
  undefined1 local_30 [4];
  deUint32 programGL;
  RandomViewport viewport;
  RenderContext *renderCtx;
  TestLog *log;
  FractionalSpacingModeCase *this_local;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  viewport._8_8_ = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*((RenderContext *)viewport._8_8_)->_vptr_RenderContext[4])();
  pcVar3 = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(pcVar3);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)local_30,(RenderTarget *)CONCAT44(extraout_var,iVar1),0x10,0x10,dVar2
            );
  this_00 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
  dVar2 = glu::ShaderProgram::getProgram(this_00);
  gl_00 = (Functions *)(**(code **)(*(long *)viewport._8_8_ + 0x18))();
  tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = (*gl_00->getUniformLocation)(dVar2,"u_tessLevelOuter1");
  genTessLevelCases();
  mode = this->m_spacing;
  __first = std::vector<float,_std::allocator<float>_>::begin
                      ((vector<float,_std::allocator<float>_> *)local_60);
  __last = std::vector<float,_std::allocator<float>_>::end
                     ((vector<float,_std::allocator<float>_> *)local_60);
  local_70 = std::
             max_element<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                       (__first._M_current,__last._M_current);
  pfVar4 = __gnu_cxx::__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>
           ::operator*(&local_70);
  local_64 = getClampedRoundedTessLevel(mode,*pfVar4);
  local_64 = local_64 + 1;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object);
  renderCtx_00 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  TransformFeedbackHandler<float>::TransformFeedbackHandler
            ((TransformFeedbackHandler<float> *)&tessLevelCaseNdx,renderCtx_00,local_64);
  outerLevel1._3_1_ = true;
  setViewport(gl_00,(RandomViewport *)local_30);
  (*gl_00->useProgram)(dVar2);
  (*gl_00->patchParameteri)(0x8e72,1);
  for (local_118 = 0;
      sVar5 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)local_60), local_118 < (int)sVar5;
      local_118 = local_118 + 1) {
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_60,(long)local_118);
    tfResult.varying.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = *pvVar6;
    (*gl_00->uniform1f)(tessLevelCases.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_,
                        tfResult.varying.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_);
    err = (*gl_00->getError)();
    glu::checkError(err,"Setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                    ,0x8cd);
    TransformFeedbackHandler<float>::renderAndGetPrimitives
              ((Result *)&additionalSegmentLocation,
               (TransformFeedbackHandler<float> *)&tessLevelCaseNdx,dVar2,0,0,
               (VertexArrayBinding *)0x0,1);
    outerLevel1._3_1_ =
         verifyFractionalSpacingSingle
                   (log_00,this->m_spacing,
                    tfResult.varying.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_,
                    (vector<float,_std::allocator<float>_> *)&tfResult,&local_144,&local_148);
    if (outerLevel1._3_1_) {
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)
                 &additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_144);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 &tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object,&local_148);
    }
    TransformFeedbackHandler<float>::Result::~Result((Result *)&additionalSegmentLocation);
    if (!outerLevel1._3_1_) break;
  }
  if (outerLevel1._3_1_ != false) {
    outerLevel1._3_1_ =
         verifyFractionalSpacingMultiple
                   (log_00,this->m_spacing,(vector<float,_std::allocator<float>_> *)local_60,
                    (vector<float,_std::allocator<float>_> *)
                    &additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<int,_std::allocator<int>_> *)
                    &tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object);
  }
  pcVar3 = "Invalid tessellation coordinates";
  if (outerLevel1._3_1_ != false) {
    pcVar3 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~outerLevel1._3_1_ & QP_TEST_RESULT_FAIL,pcVar3);
  TransformFeedbackHandler<float>::~TransformFeedbackHandler
            ((TransformFeedbackHandler<float> *)&tessLevelCaseNdx);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &tfHandler.m_tfPrimQuery.super_ObjectWrapper.m_object);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &additionalSegmentLocations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_60);
  return STOP;
}

Assistant:

FractionalSpacingModeCase::IterateResult FractionalSpacingModeCase::iterate (void)
{
	typedef TransformFeedbackHandler<float> TFHandler;

	TestLog&						log							= m_testCtx.getLog();
	const RenderContext&			renderCtx					= m_context.getRenderContext();
	const RandomViewport			viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32					programGL					= m_program->getProgram();
	const glw::Functions&			gl							= renderCtx.getFunctions();

	const int						tessLevelOuter1Loc			= gl.getUniformLocation(programGL, "u_tessLevelOuter1");

	// Second outer tessellation levels.
	const vector<float>				tessLevelCases				= genTessLevelCases();
	const int						maxNumVertices				= 1 + getClampedRoundedTessLevel(m_spacing, *std::max_element(tessLevelCases.begin(), tessLevelCases.end()));
	vector<float>					additionalSegmentLengths;
	vector<int>						additionalSegmentLocations;

	const TFHandler					tfHandler					(m_context.getRenderContext(), maxNumVertices);

	bool							success						= true;

	setViewport(gl, viewport);
	gl.useProgram(programGL);

	gl.patchParameteri(GL_PATCH_VERTICES, 1);

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < (int)tessLevelCases.size(); tessLevelCaseNdx++)
	{
		const float outerLevel1 = tessLevelCases[tessLevelCaseNdx];

		gl.uniform1f(tessLevelOuter1Loc, outerLevel1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Setup failed");

		{
			const TFHandler::Result		tfResult = tfHandler.renderAndGetPrimitives(programGL, GL_POINTS, 0, DE_NULL, 1);
			float						additionalSegmentLength;
			int							additionalSegmentLocation;

			success = verifyFractionalSpacingSingle(log, m_spacing, outerLevel1, tfResult.varying,
													additionalSegmentLength, additionalSegmentLocation);

			if (!success)
				break;

			additionalSegmentLengths.push_back(additionalSegmentLength);
			additionalSegmentLocations.push_back(additionalSegmentLocation);
		}
	}

	if (success)
		success = verifyFractionalSpacingMultiple(log, m_spacing, tessLevelCases, additionalSegmentLengths, additionalSegmentLocations);

	m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, success ? "Pass" : "Invalid tessellation coordinates");
	return STOP;
}